

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::transfer_n_backward
          (btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           *this,size_type n,size_type dest_i,size_type src_i,
          btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          *src_node,allocator_type *alloc)

{
  long lVar1;
  
  if ((((ulong)src_node & 7) == 0) && (((ulong)this & 7) == 0)) {
    lVar1 = n << 3;
    if (lVar1 != 0) {
      do {
        *(undefined8 *)(this + lVar1 + dest_i * 8 + 4) =
             *(undefined8 *)(src_node + lVar1 + src_i * 8 + 4);
        lVar1 = lVar1 + -8;
      } while (lVar1 != 0);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = char]"
               );
}

Assistant:

void transfer_n_backward(const size_type n, const size_type dest_i,
                           const size_type src_i, btree_node *src_node,
                           allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i + n), *end = src - n,
                   *dest = slot(dest_i + n);
         src != end; --src, --dest) {
      // If we modified the loop index calculations above to avoid the -1s here,
      // it would result in UB in the computation of `end` (and possibly `src`
      // as well, if n == 0), since slot() is effectively an array index and it
      // is UB to compute the address of any out-of-bounds array element except
      // for one-past-the-end.
      transfer(dest - 1, src - 1, alloc);
    }
  }